

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

int lws_role_call_client_bind(lws *wsi,lws_client_connect_info *i)

{
  char **ppcVar1;
  int iVar2;
  char **ppcVar3;
  int m;
  lws_role_ops *ar;
  lws_role_ops **ppxx;
  lws_client_connect_info *i_local;
  lws *wsi_local;
  
  ar = (lws_role_ops *)available_roles;
  while( true ) {
    do {
      if (ar->name == (char *)0x0) {
        iVar2 = rops_client_bind_raw_skt(wsi,i);
        if (iVar2 == 0) {
          return 1;
        }
        return 0;
      }
      ppcVar3 = &ar->alpn;
      ppcVar1 = &ar->name;
      ar = (lws_role_ops *)ppcVar3;
    } while (*(long *)(*ppcVar1 + 0xa0) == 0);
    iVar2 = (**(code **)(*ppcVar1 + 0xa0))(wsi,i);
    if (iVar2 < 0) break;
    if (iVar2 != 0) {
      return 0;
    }
  }
  return iVar2;
}

Assistant:

int
lws_role_call_client_bind(struct lws *wsi,
			  const struct lws_client_connect_info *i)
{
	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->client_bind) {
			int m = ar->client_bind(wsi, i);
			if (m < 0)
				return m;
			if (m)
				return 0;
		}
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	/* fall back to raw socket role if, eg, h1 not configured */

	if (role_ops_raw_skt.client_bind &&
	    role_ops_raw_skt.client_bind(wsi, i))
		return 0;

	return 1;
}